

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_multi.hpp
# Opt level: O2

void __thiscall Infector::Container::bindAsNothing<Booom>(Container *this)

{
  mapped_type *pmVar1;
  key_type local_18;
  
  must_not_have<Booom>(this);
  local_18._M_target = (type_info *)&Booom::typeinfo;
  pmVar1 = std::__detail::
           _Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_Infector::Container::Binding>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->typeMap,&local_18);
  (pmVar1->type)._M_target = (type_info *)&Booom::typeinfo;
  pmVar1->single = false;
  return;
}

Assistant:

void Container::bindAsNothing(){
        bool tests = reduced_type_tests<T>(); // Compile time tests.
        (void) tests; //fix unused variable warning
        must_not_have<T>(); // A Concrete type can't be registered twice.


        typeMap[std::type_index(typeid(T))]
                = Binding(std::type_index(typeid(T)), false);
    }